

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNFOnTheFly.cpp
# Opt level: O2

ClauseIterator __thiscall
Inferences::produceClauses
          (Inferences *this,Clause *c,bool generating,SkolemisingFormulaIndex *index)

{
  Literal *lit;
  TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_> *pTVar1;
  Term *term;
  char cVar2;
  bool bVar3;
  Proxy PVar4;
  int iVar5;
  uint uVar6;
  undefined8 in_RAX;
  TermList TVar7;
  TermList TVar8;
  TermList sort;
  ulong uVar9;
  TermList TVar10;
  Literal *pLVar11;
  Literal *d;
  Literal *d_00;
  Clause *pCVar12;
  TermList TVar13;
  undefined4 extraout_var;
  TermList TVar14;
  Literal *pLVar15;
  Clause *pCVar16;
  undefined8 uVar17;
  undefined7 in_register_00000011;
  ulong uVar18;
  InferenceRule r;
  undefined1 *this_00;
  TermList term_00;
  pair<Kernel::TermList,_Kernel::TermList> pVar19;
  Iterator it;
  Literal *in_stack_fffffffffffffeb8;
  Stack<Kernel::Clause_*> local_118;
  SkolemisingFormulaIndex *local_f0;
  TermList local_e8;
  TermList head;
  VirtualIterator<Kernel::Clause_*> local_d8;
  undefined4 local_cc;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>_>
  results;
  TermList resultSort;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>
  tqr;
  
  uVar17 = CONCAT71((int7)((ulong)in_RAX >> 8),
                    produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::eager);
  if ((produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::eager == '\0') &&
     (uVar17 = __cxa_guard_acquire(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                    ::eager), (int)uVar17 != 0)) {
    produceClauses::eager = *(int *)(Lib::env + 0xf538) == 0;
    uVar17 = __cxa_guard_release(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                  ::eager);
  }
  uVar17 = CONCAT71((int7)((ulong)uVar17 >> 8),
                    produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::simp);
  if ((produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::simp == '\0') &&
     (uVar17 = __cxa_guard_acquire(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                    ::simp), (int)uVar17 != 0)) {
    produceClauses::simp = *(int *)(Lib::env + 0xf538) == 2;
    uVar17 = __cxa_guard_release(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                  ::simp);
  }
  uVar17 = CONCAT71((int7)((ulong)uVar17 >> 8),
                    produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::gen);
  if ((produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::gen == '\0') &&
     (uVar17 = __cxa_guard_acquire(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                    ::gen), (int)uVar17 != 0)) {
    produceClauses::gen = *(int *)(Lib::env + 0xf538) == 1;
    uVar17 = __cxa_guard_release(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                  ::gen);
  }
  uVar17 = CONCAT71((int7)((ulong)uVar17 >> 8),
                    produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
                    simp_except_not_be_off);
  if ((produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
       simp_except_not_be_off == '\0') &&
     (uVar17 = __cxa_guard_acquire(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                    ::simp_except_not_be_off), (int)uVar17 != 0)) {
    produceClauses::simp_except_not_be_off = *(int *)(Lib::env + 0xf538) == 4;
    uVar17 = __cxa_guard_release(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                  ::simp_except_not_be_off);
  }
  uVar17 = CONCAT71((int7)((ulong)uVar17 >> 8),
                    produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
                    simp_except_not_and_be);
  if ((produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
       simp_except_not_and_be == '\0') &&
     (uVar17 = __cxa_guard_acquire(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                    ::simp_except_not_and_be), (int)uVar17 != 0)) {
    produceClauses::simp_except_not_and_be = *(int *)(Lib::env + 0xf538) == 5;
    uVar17 = __cxa_guard_release(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                  ::simp_except_not_and_be);
  }
  if (produceClauses::simp_except_not_be_off == false) {
    local_e8._content._0_4_ =
         (int)CONCAT71((int7)((ulong)uVar17 >> 8),
                       produceClauses::simp_except_not_and_be ^ 1U | generating);
  }
  else {
    local_e8._content = (ulong)local_e8._content._4_4_ << 0x20;
  }
  cVar2 = produceClauses::gen;
  if (((generating) && (cVar2 = produceClauses::simp, produceClauses::eager != false)) ||
     (cVar2 == '\x01')) {
    Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
  }
  else {
    local_cc = (undefined4)CONCAT71(in_register_00000011,generating);
    local_f0 = index;
    TVar7._content = (uint64_t)Kernel::Term::foolTrue();
    TVar8._content = (uint64_t)Kernel::Term::foolFalse();
    sort = Kernel::AtomicSort::boolSort();
    if ((produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::args == '\0') &&
       (iVar5 = __cxa_guard_acquire(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)
                                     ::args), iVar5 != 0)) {
      produceClauses::args._cursor = (TermList *)0x0;
      produceClauses::args._end = (TermList *)0x0;
      produceClauses::args._capacity = 0;
      produceClauses::args._stack = (TermList *)0x0;
      __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&produceClauses::args,&__dso_handle);
      __cxa_guard_release(&produceClauses(Kernel::Clause*,bool,Indexing::SkolemisingFormulaIndex*)::
                           args);
    }
    head._content = 2;
    local_118._cursor = (Clause **)0x0;
    local_118._end = (Clause **)0x0;
    local_118._capacity = 0;
    local_118._stack = (Clause **)0x0;
    uVar17 = *(undefined8 *)&c->field_0x38;
    for (uVar18 = 0; ((uint)uVar17 & 0xfffff) != uVar18; uVar18 = uVar18 + 1) {
      lit = c->_literals[uVar18];
      uVar9 = (ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff);
      TVar13._content = (lit->super_Term)._args[uVar9 - 1]._content;
      TVar14._content = (lit->super_Term)._args[uVar9]._content;
      bVar3 = ApplicativeHelper::isBool(TVar14);
      TVar10._content = TVar13._content;
      term_00._content = TVar14._content;
      if ((!bVar3) &&
         (bVar3 = ApplicativeHelper::isBool(TVar13), TVar10._content = TVar14._content,
         term_00._content = TVar13._content, !bVar3)) {
        TVar10 = Kernel::SortHelper::getEqualityArgumentSort(lit);
        if ((TVar10._content == sort._content & (byte)local_e8._content) != 1) goto LAB_003da98b;
        pLVar15 = Kernel::Literal::createEquality(true,TVar14,TVar7,sort);
        pLVar11 = Kernel::Literal::createEquality(true,TVar14,TVar8,sort);
        d = Kernel::Literal::createEquality(true,TVar13,TVar7,sort);
        d_00 = Kernel::Literal::createEquality(true,TVar13,TVar8,sort);
        if (((lit->super_Term)._args[0]._content & 4) == 0) {
          pCVar16 = replaceLits(c,lit,pLVar15,BINARY_CONN_ELIMINATION,true,d,
                                in_stack_fffffffffffffeb8);
          pCVar12 = replaceLits(c,lit,pLVar11,BINARY_CONN_ELIMINATION,true,d_00,
                                in_stack_fffffffffffffeb8);
          Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar16);
          Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar12);
        }
        else {
          pCVar16 = replaceLits(c,lit,pLVar15,BINARY_CONN_ELIMINATION,true,d_00,
                                in_stack_fffffffffffffeb8);
          pCVar12 = replaceLits(c,lit,pLVar11,BINARY_CONN_ELIMINATION,true,d,
                                in_stack_fffffffffffffeb8);
          Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar16);
          Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar12);
        }
        goto LAB_003dabc1;
      }
      ApplicativeHelper::getHeadAndArgs(TVar10,&head,&produceClauses::args);
      PVar4 = ApplicativeHelper::getProxy(head);
      if (((PVar4 < (PI|EXISTS)) && ((0x860U >> (PVar4 & 0x1f) & 1) != 0)) ||
         (((char)local_cc != '\0' && ((PVar4 != NOT && (produceClauses::gen == false))))))
      goto LAB_003da98b;
      bVar3 = ApplicativeHelper::isTrue(term_00);
      uVar9 = (lit->super_Term)._args[0]._content;
      switch(PVar4) {
      case AND:
        if ((long)produceClauses::args._cursor - (long)produceClauses::args._stack == 0x10) {
          if (bVar3 == ((uVar9 & 4) == 0)) {
            pLVar15 = Kernel::Literal::createEquality
                                (true,(TermList)(produceClauses::args._stack)->_content,TVar8,sort);
            pLVar11 = Kernel::Literal::createEquality
                                (true,(TermList)produceClauses::args._stack[1]._content,TVar8,sort);
            pCVar16 = replaceLits(c,lit,pLVar15,BINARY_CONN_ELIMINATION,false,pLVar11,
                                  in_stack_fffffffffffffeb8);
            Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar16);
          }
          else {
            pLVar15 = Kernel::Literal::createEquality
                                (true,(TermList)(produceClauses::args._stack)->_content,TVar7,sort);
            pLVar11 = Kernel::Literal::createEquality
                                (true,(TermList)produceClauses::args._stack[1]._content,TVar7,sort);
            pCVar16 = replaceLits(c,lit,pLVar15,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,
                                  in_stack_fffffffffffffeb8);
            pCVar12 = replaceLits(c,lit,pLVar11,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,
                                  in_stack_fffffffffffffeb8);
            Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar16);
            Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar12);
          }
          goto LAB_003dabc1;
        }
        break;
      case OR:
        if ((long)produceClauses::args._cursor - (long)produceClauses::args._stack == 0x10) {
          if (bVar3 == ((uVar9 & 4) == 0)) {
            pLVar15 = Kernel::Literal::createEquality
                                (true,(TermList)(produceClauses::args._stack)->_content,TVar8,sort);
            pLVar11 = Kernel::Literal::createEquality
                                (true,(TermList)produceClauses::args._stack[1]._content,TVar8,sort);
            pCVar16 = replaceLits(c,lit,pLVar15,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,
                                  in_stack_fffffffffffffeb8);
            pCVar12 = replaceLits(c,lit,pLVar11,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,
                                  in_stack_fffffffffffffeb8);
            Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar16);
            Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar12);
          }
          else {
            pLVar15 = Kernel::Literal::createEquality
                                (true,(TermList)(produceClauses::args._stack)->_content,TVar7,sort);
            pLVar11 = Kernel::Literal::createEquality
                                (true,(TermList)produceClauses::args._stack[1]._content,TVar7,sort);
            pCVar16 = replaceLits(c,lit,pLVar15,BINARY_CONN_ELIMINATION,false,pLVar11,
                                  in_stack_fffffffffffffeb8);
            Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar16);
          }
          goto LAB_003dabc1;
        }
        break;
      case IMP:
        if ((long)produceClauses::args._cursor - (long)produceClauses::args._stack == 0x10) {
          if (bVar3 == ((uVar9 & 4) == 0)) {
            pLVar15 = Kernel::Literal::createEquality
                                (true,(TermList)produceClauses::args._stack[1]._content,TVar7,sort);
            pLVar11 = Kernel::Literal::createEquality
                                (true,(TermList)(produceClauses::args._stack)->_content,TVar8,sort);
            pCVar16 = replaceLits(c,lit,pLVar11,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,
                                  in_stack_fffffffffffffeb8);
            pCVar12 = replaceLits(c,lit,pLVar15,BINARY_CONN_ELIMINATION,true,(Literal *)0x0,
                                  in_stack_fffffffffffffeb8);
            Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar16);
            Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar12);
          }
          else {
            pLVar15 = Kernel::Literal::createEquality
                                (true,(TermList)produceClauses::args._stack[1]._content,TVar8,sort);
            pLVar11 = Kernel::Literal::createEquality
                                (true,(TermList)(produceClauses::args._stack)->_content,TVar7,sort);
            pCVar16 = replaceLits(c,lit,pLVar15,BINARY_CONN_ELIMINATION,false,pLVar11,
                                  in_stack_fffffffffffffeb8);
            Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar16);
          }
          goto LAB_003dabc1;
        }
        break;
      default:
        if (((PVar4 & ~OR) != PI) || (produceClauses::args._cursor == produceClauses::args._stack))
        break;
        bVar3 = bVar3 != ((uVar9 & 4) == 0);
        if (bVar3) {
          TVar8._content = TVar7._content;
        }
        TVar7 = Kernel::SortHelper::getResultSort(head._content);
        TVar7._content =
             *(uint64_t *)
              (TVar7._content + 0x28 + (ulong)(*(uint *)(TVar7._content + 0xc) & 0xfffffff) * 8);
        if ((bool)((~bVar3 | PVar4 != PI) & (PVar4 != SIGMA || bVar3))) {
          if (local_f0 != (SkolemisingFormulaIndex *)0x0) {
            TVar13 = Kernel::SortHelper::getResultSort(TVar10._content);
            pTVar1 = (local_f0->super_TermIndex<Indexing::TermWithValue<Kernel::TermList>_>)._is.
                     _M_t.
                     super___uniq_ptr_impl<Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>,_std::default_delete<Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>_*,_std::default_delete<Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>_>_>
                     .
                     super__Head_base<0UL,_Indexing::TermIndexingStructure<Indexing::TermWithValue<Kernel::TermList>_>_*,_false>
                     ._M_head_impl;
            (*pTVar1->_vptr_TermIndexingStructure[6])
                      (&results,pTVar1,TVar10._content,TVar13._content);
            iVar5 = (*(results._core)->_vptr_IteratorCore[2])();
            if ((char)iVar5 != '\0') {
              (*(results._core)->_vptr_IteratorCore[3])(&tqr);
              TVar13._content._0_4_ =
                   (*(tqr.unifier._obj)->_vptr_ResultSubstitution[0xf])
                             (tqr.unifier._obj,((tqr.data)->value)._content);
              TVar13._content._4_4_ = extraout_var;
              TVar13 = ApplicativeHelper::createAppTerm
                                 (TVar7,(produceClauses::args._stack)->_content,TVar13);
              Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&tqr.unifier);
              Lib::
              VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>_>
              ::~VirtualIterator(&results);
              goto LAB_003db3ae;
            }
            Lib::
            VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>_>
            ::~VirtualIterator(&results);
          }
          term = (Term *)(produceClauses::args._stack)->_content;
          if ((sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts == '\0') &&
             (iVar5 = __cxa_guard_acquire(&sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts
                                         ), iVar5 != 0)) {
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts = 1;
            _DAT_00a109a4 = 0;
            uRam0000000000a109ac = 0;
            _DAT_00a109b4 = 0;
            _DAT_00a109b8 = 0;
            uRam0000000000a109bc = 0;
            uRam0000000000a109c0 = 0;
            _DAT_00a109c4 = 0;
            __cxa_atexit(Lib::
                         DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                         ::~DHMap,&sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts,
                         &__dso_handle);
            __cxa_guard_release(&sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts);
          }
          Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
                    ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     &sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts);
          if (((ulong)term & 3) == 0) {
            Kernel::VariableWithSortIterator::VariableWithSortIterator
                      ((VariableWithSortIterator *)&tqr,term);
            while (bVar3 = Kernel::VariableWithSortIterator::hasNext
                                     ((VariableWithSortIterator *)&tqr), bVar3) {
              pVar19 = Kernel::VariableWithSortIterator::next((VariableWithSortIterator *)&tqr);
              Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
              insert((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     &sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts,
                     (uint)(pVar19.first._content._content >> 2),pVar19.second._content);
            }
          }
          else {
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                      ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *
                       )&sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts,
                       (uint)((ulong)term >> 2),TVar7);
            if ((TVar7._content & 3) != 0) {
              TVar13 = Kernel::AtomicSort::superSort();
              Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
              insert((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     &sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts,
                     (uint)(TVar7._content >> 2),TVar13);
              goto LAB_003db1c4;
            }
            Kernel::VariableWithSortIterator::VariableWithSortIterator
                      ((VariableWithSortIterator *)&tqr,(Term *)TVar7._content);
            while (bVar3 = Kernel::VariableWithSortIterator::hasNext
                                     ((VariableWithSortIterator *)&tqr), bVar3) {
              pVar19 = Kernel::VariableWithSortIterator::next((VariableWithSortIterator *)&tqr);
              Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
              insert((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     &sigmaRemoval(Kernel::TermList,Kernel::TermList)::varSorts,
                     (uint)(pVar19.first._content._content >> 2),pVar19.second._content);
            }
          }
          Kernel::VariableWithSortIterator::~VariableWithSortIterator
                    ((VariableWithSortIterator *)&tqr);
LAB_003db1c4:
          if ((sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts == '\0') &&
             (iVar5 = __cxa_guard_acquire(&sigmaRemoval(Kernel::TermList,Kernel::TermList)::
                                           termVarSorts), iVar5 != 0)) {
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._16_8_ = 0;
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._24_8_ = 0;
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._0_8_ = 0;
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._8_8_ = 0;
            __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,
                         sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts,&__dso_handle
                        );
            __cxa_guard_release(&sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts);
          }
          if ((sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars == '\0') &&
             (iVar5 = __cxa_guard_acquire(&sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars
                                         ), iVar5 != 0)) {
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._16_8_ = 0;
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._24_8_ = 0;
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._0_8_ = 0;
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._8_8_ = 0;
            __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,
                         sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars,&__dso_handle);
            __cxa_guard_release(&sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars);
          }
          local_e8._content = TVar7._content;
          if ((sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars == '\0') &&
             (iVar5 = __cxa_guard_acquire(&sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars
                                         ), iVar5 != 0)) {
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._16_8_ = 0;
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._24_8_ = 0;
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._0_8_ = 0;
            sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._8_8_ = 0;
            __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,
                         sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars,&__dso_handle);
            __cxa_guard_release(&sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars);
          }
          sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._16_8_ =
               sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts._8_8_;
          sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._16_8_ =
               sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars._8_8_;
          sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._16_8_ =
               sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._8_8_;
          results._core =
               (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>_>
                *)CONCAT44(uRam0000000000a109bc,_DAT_00a109b8);
          while (bVar3 = Lib::
                         DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                         ::IteratorBase::hasNext((IteratorBase *)&results),
                TVar7._content = local_e8._content, bVar3) {
            iVar5 = *(int *)((long)&(results._core)->_vptr_IteratorCore + 4);
            TVar7._content = *(uint64_t *)&(results._core)->_refCnt;
            results._core = results._core + 1;
            TVar13 = Kernel::AtomicSort::superSort();
            this_00 = sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars;
            if (TVar7._content != TVar13._content) {
              Lib::Stack<Kernel::TermList>::push
                        ((Stack<Kernel::TermList> *)
                         sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts,TVar7);
              this_00 = sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars;
            }
            TVar7._content._4_4_ = 0;
            TVar7._content._0_4_ = iVar5 * 4 + 1;
            Lib::Stack<Kernel::TermList>::push((Stack<Kernel::TermList> *)this_00,TVar7);
          }
          resultSort._content =
               *(uint64_t *)
                (local_e8._content + 0x28 +
                (ulong)(*(uint *)(local_e8._content + 0xc) & 0xfffffff) * 8);
          Kernel::SortHelper::normaliseArgSorts
                    ((TermStack *)sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars,
                     (TermStack *)sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts);
          Lib::Stack<Kernel::TermList>::Stack
                    ((Stack<Kernel::TermList> *)&tqr,
                     (Stack<Kernel::TermList> *)
                     sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars);
          Kernel::SortHelper::normaliseSort((TermStack *)&tqr,&resultSort);
          Lib::Stack<Kernel::TermList>::~Stack((Stack<Kernel::TermList> *)&tqr);
          TVar13 = Kernel::AtomicSort::arrowSort
                             ((TermStack *)
                              sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVarSorts,
                              resultSort);
          uVar6 = (uint)((ulong)(sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._16_8_ -
                                sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._8_8_) >>
                        3);
          uVar6 = Shell::Skolem::addSkolemFunction(uVar6,uVar6,(TermList *)0x0,TVar13,(char *)0x0);
          TVar13._content =
               (uint64_t)
               Kernel::Term::create
                         (uVar6,(uint)((ulong)(sigmaRemoval(Kernel::TermList,Kernel::TermList)::
                                               typeVars._16_8_ -
                                              sigmaRemoval(Kernel::TermList,Kernel::TermList)::
                                              typeVars._8_8_) >> 3),
                          (TermList *)
                          sigmaRemoval(Kernel::TermList,Kernel::TermList)::typeVars._8_8_);
          TVar14 = Kernel::SortHelper::getResultSort((Term *)TVar13._content);
          TVar13 = ApplicativeHelper::createAppTerm
                             (TVar14,TVar13,
                              (TermStack *)sigmaRemoval(Kernel::TermList,Kernel::TermList)::termVars
                             );
          if (local_f0 != (SkolemisingFormulaIndex *)0x0) {
            Kernel::SortHelper::getResultSort((Term *)TVar10._content);
            Indexing::SkolemisingFormulaIndex::insertFormula(local_f0,TVar10,TVar13);
          }
          TVar13 = ApplicativeHelper::createAppTerm
                             (TVar7,(produceClauses::args._stack)->_content,TVar13);
LAB_003db3ae:
          r = VSIGMA_ELIMINATION;
        }
        else {
          TVar13 = (TermList)(produceClauses::args._stack)->_content;
          uVar6 = Kernel::Clause::maxVar(c);
          uVar6 = uVar6 * 4 + 5;
          do {
            TVar14._content._4_4_ = 0;
            TVar14._content._0_4_ = uVar6;
            TVar13 = ApplicativeHelper::createAppTerm(TVar7,TVar13,TVar14);
            TVar7._content =
                 *(uint64_t *)
                  (TVar7._content + 0x20 + (ulong)(*(uint *)(TVar7._content + 0xc) & 0xfffffff) * 8)
            ;
            TVar14 = Kernel::AtomicSort::boolSort();
            uVar6 = uVar6 + 4;
          } while (TVar7._content != TVar14._content);
          r = VPI_ELIMINATION;
        }
        pLVar15 = Kernel::Literal::createEquality(true,TVar13,TVar8,sort);
        pCVar16 = replaceLits(c,lit,pLVar15,r,false,(Literal *)0x0,in_stack_fffffffffffffeb8);
        Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar16);
LAB_003dabc1:
        it.super_RefIterator._stack = (Stack<Kernel::Clause_*> *)local_118._cursor;
        it.super_RefIterator._pointer = (Clause **)&local_d8;
        Lib::getUniquePersistentIterator<Lib::Stack<Kernel::Clause*>::Iterator>(it);
        Lib::pvi<Lib::VirtualIterator<Kernel::Clause*>>((Lib *)this,&local_d8);
        Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&local_d8);
        goto LAB_003dabf2;
      case NOT:
        if (produceClauses::args._cursor != produceClauses::args._stack) {
          if (bVar3 != ((uVar9 & 4) == 0)) {
            TVar7._content = TVar8._content;
          }
          pLVar15 = Kernel::Literal::createEquality
                              (true,(TermList)(produceClauses::args._stack)->_content,TVar7,sort);
          pCVar16 = replaceLits(c,lit,pLVar15,HOL_NOT_ELIMINATION,false,(Literal *)0x0,
                                in_stack_fffffffffffffeb8);
          Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar16);
          goto LAB_003dabc1;
        }
        break;
      case EQUALS:
        if ((long)produceClauses::args._cursor - (long)produceClauses::args._stack == 0x10) {
          TVar8 = Kernel::SortHelper::getResultSort(head._content);
          pLVar15 = Kernel::Literal::createEquality
                              (bVar3 != ((uVar9 & 4) == 0),
                               (TermList)(produceClauses::args._stack)->_content,
                               (TermList)produceClauses::args._stack[1]._content,
                               (TermList)
                               *(uint64_t *)
                                (TVar8._content + 0x28 +
                                (ulong)(*(uint *)(TVar8._content + 0xc) & 0xfffffff) * 8));
          pCVar16 = replaceLits(c,lit,pLVar15,HOL_EQUALITY_ELIMINATION,false,(Literal *)0x0,
                                in_stack_fffffffffffffeb8);
          Lib::Stack<Kernel::Clause_*>::push(&local_118,pCVar16);
          goto LAB_003dabc1;
        }
      }
LAB_003da98b:
    }
    Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
LAB_003dabf2:
    Lib::Stack<Kernel::Clause_*>::~Stack(&local_118);
  }
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator produceClauses(Clause* c, bool generating, SkolemisingFormulaIndex* index)
{
  static bool eager = env.options->cnfOnTheFly() == Options::CNFOnTheFly::EAGER;
  static bool simp = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_SIMP;
  static bool gen = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_GEN;
  static bool simp_except_not_be_off = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_SIMP_NOT_GEN_BOOL_EQ_OFF;
  static bool simp_except_not_and_be = env.options->cnfOnTheFly() == Options::CNFOnTheFly::LAZY_SIMP_NOT_GEN_BOOL_EQ_GEN;
  bool not_be = simp_except_not_be_off || (!generating && simp_except_not_and_be);


  if(generating && (eager || simp)){ return ClauseIterator::getEmpty(); }
  if(!generating && gen){ return ClauseIterator::getEmpty(); }

  TermList troo = TermList(Term::foolTrue());
  TermList fols = TermList(Term::foolFalse());
  TermList boolSort = AtomicSort::boolSort();

  static TermStack args;
  TermList head;
 
  ClauseStack resultStack;
  unsigned clength = c->length();

  for(unsigned i = 0; i < clength; i++){
    Literal* lit = (*c)[i];
    TermList lhs = *lit->nthArgument(0);
    TermList rhs = *lit->nthArgument(1);
    TermList term;
    TermList boolVal;
    if(AH::isBool(lhs)){
      boolVal = lhs;
      term = rhs;
    } else if(AH::isBool(rhs)){
      boolVal = rhs;
      term = lhs;
    } else if(SortHelper::getEqualityArgumentSort(lit) == boolSort && !not_be) {
      //equality or diseqality between boolean terms
      Literal* lhsTroo = Literal::createEquality(true, lhs, troo, boolSort);
      Literal* lhsFols = Literal::createEquality(true, lhs, fols, boolSort);
      Literal* rhsTroo = Literal::createEquality(true, rhs, troo, boolSort);
      Literal* rhsFols = Literal::createEquality(true, rhs, fols, boolSort);
      if(lit->polarity()){
        Clause* res1 = replaceLits(c, lit, lhsTroo, convert(Signature::IFF), true, rhsFols);
        Clause* res2 = replaceLits(c, lit, lhsFols, convert(Signature::IFF), true, rhsTroo);
        resultStack.push(res1);
        resultStack.push(res2);
      } else {
        Clause* res1 = replaceLits(c, lit, lhsTroo, convert(Signature::XOR), true, rhsTroo);
        Clause* res2 = replaceLits(c, lit, lhsFols, convert(Signature::XOR), true, rhsFols);
        resultStack.push(res1);
        resultStack.push(res2);
      }
      goto afterLoop;
    } else {
      continue;
    }

    AH::getHeadAndArgs(term, head, args);
    Signature::Proxy prox = AH::getProxy(head);
    if(prox == Signature::NOT_PROXY || prox == Signature::IFF ||
       prox == Signature::XOR){
      continue;
    }

    if(generating && !gen && prox != Signature::NOT){
      continue;
    }

    bool positive = AH::isTrue(boolVal) == lit->polarity();

    if((prox == Signature::OR) && (args.size() == 2)){
      if(positive){
        Literal* l1 = Literal::createEquality(true, args[0], troo, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], troo, boolSort);
        Clause* res = replaceLits(c, lit, l1, convert(prox), false, l2);
        resultStack.push(res);
        goto afterLoop;
      } else {
        Literal* l1 = Literal::createEquality(true, args[0], fols, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], fols, boolSort);
        Clause* res1 = replaceLits(c, lit, l1, convert(prox), true);
        Clause* res2 = replaceLits(c, lit, l2, convert(prox), true);
        resultStack.push(res1);
        resultStack.push(res2);
        goto afterLoop;
      }
    }
  
    if((prox == Signature::AND) && (args.size() == 2)){
      if(positive){
        Literal* l1 = Literal::createEquality(true, args[0], troo, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], troo, boolSort);
        Clause* res1 = replaceLits(c, lit, l1, convert(prox), true);
        Clause* res2 = replaceLits(c, lit, l2, convert(prox), true);
        resultStack.push(res1);
        resultStack.push(res2);
        goto afterLoop;
      } else {
        Literal* l1 = Literal::createEquality(true, args[0], fols, boolSort);
        Literal* l2 = Literal::createEquality(true, args[1], fols, boolSort);
        Clause* res = replaceLits(c, lit, l1, convert(prox), false, l2);
        resultStack.push(res);
        goto afterLoop;
      }
    }

    if((prox == Signature::IMP) && (args.size() == 2)){
      if(positive){
        Literal* l1 = Literal::createEquality(true, args[1], fols, boolSort);
        Literal* l2 = Literal::createEquality(true, args[0], troo, boolSort);
        Clause* res = replaceLits(c, lit, l1, convert(prox), false, l2);
        resultStack.push(res);
        goto afterLoop;
      } else {
        Literal* l2 = Literal::createEquality(true, args[1], troo, boolSort);
        Literal* l1 = Literal::createEquality(true, args[0], fols, boolSort);
        Clause* res1 = replaceLits(c, lit, l1, convert(prox), true);
        Clause* res2 = replaceLits(c, lit, l2, convert(prox), true);        
        resultStack.push(res1);
        resultStack.push(res2);
        goto afterLoop;
      }
    }

    if((prox == Signature::EQUALS) && (args.size() == 2)){
      TermList srt = *SortHelper::getResultSort(head.term()).term()->nthArgument(0);
      Literal* l1 = Literal::createEquality(positive, args[0], args[1], srt);
      Clause* res = replaceLits(c, lit, l1, convert(prox), false);
      resultStack.push(res);
      goto afterLoop;
    }

    if((prox == Signature::NOT) && (args.size())){
      TermList rhs = positive ? fols : troo;
      Literal* l1 = Literal::createEquality(true, args[0], rhs, boolSort);
      Clause* res = replaceLits(c, lit, l1, convert(prox), false);
      resultStack.push(res);
      goto afterLoop;
    }

    if((prox == Signature::PI || prox == Signature::SIGMA ) && (args.size())){
      TermList rhs = positive ? troo : fols; 
      TermList srt = *SortHelper::getResultSort(head.term()).term()->nthArgument(0);
      TermList newTerm;
      InferenceRule rule;
      if((prox == Signature::PI && positive) || 
         (prox == Signature::SIGMA && !positive)){
        rule = convert(Signature::PI);
        newTerm = piRemoval(args[0], c, srt);
      } else {
        ASS(term.isTerm());
        bool newTermCreated = false;
        if(index){
          auto results = index->getGeneralizations(TypedTermList(term.term()), true);
          if(results.hasNext()){
            auto tqr = results.next();
            TermList skolemTerm = tqr.data->value;
            skolemTerm = tqr.unifier->applyToBoundResult(skolemTerm);
            newTerm = AH::createAppTerm(srt, args[0], skolemTerm);
            newTermCreated = true;
          }
        }
        if(!newTermCreated){
          TermList skolemTerm = sigmaRemoval(args[0], srt);
          if(index){
            index->insertFormula(TypedTermList(term.term()), skolemTerm);
          }
          newTerm = AH::createAppTerm(srt, args[0], skolemTerm);
        }
        rule = convert(Signature::SIGMA);
      }
      Literal* l1 = Literal::createEquality(true, newTerm, rhs, boolSort);
      Clause* res = replaceLits(c, lit, l1, rule, false);
      resultStack.push(res);
      goto afterLoop;
    }

  }
  
  return ClauseIterator::getEmpty(); 

afterLoop:  

  return pvi(getUniquePersistentIterator(ClauseStack::Iterator(resultStack)));

}